

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  uint uVar1;
  ulong uVar2;
  
  Validate(this,&pAnimation->mName);
  uVar1 = pAnimation->mNumChannels;
  if (uVar1 == 0) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if (pAnimation->mChannels != (aiNodeAnim **)0x0) {
    uVar2 = 0;
    while( true ) {
      if (uVar1 <= uVar2) {
        return;
      }
      if (pAnimation->mChannels[uVar2] == (aiNodeAnim *)0x0) break;
      Validate(this,pAnimation,pAnimation->mChannels[uVar2]);
      uVar2 = uVar2 + 1;
      uVar1 = pAnimation->mNumChannels;
    }
    ReportError(this,"aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                uVar2 & 0xffffffff);
  }
  ReportError(this,"aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",(ulong)uVar1);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all materials
    if (pAnimation->mNumChannels)
    {
        if (!pAnimation->mChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}